

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomCustomWidget::~DomCustomWidget(DomCustomWidget *this)

{
  void *pvVar1;
  DomSize *this_00;
  long in_RDI;
  DomSlots *in_stack_ffffffffffffffd0;
  DomPropertySpecifications *this_01;
  
  pvVar1 = *(void **)(in_RDI + 0x38);
  if (pvVar1 != (void *)0x0) {
    DomHeader::~DomHeader((DomHeader *)in_stack_ffffffffffffffd0);
    operator_delete(pvVar1,0x38);
  }
  this_00 = *(DomSize **)(in_RDI + 0x40);
  if (this_00 != (DomSize *)0x0) {
    DomSize::~DomSize(this_00);
    operator_delete(this_00,0xc);
  }
  pvVar1 = *(void **)(in_RDI + 0x80);
  if (pvVar1 != (void *)0x0) {
    DomSlots::~DomSlots(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1,0x38);
  }
  this_01 = *(DomPropertySpecifications **)(in_RDI + 0x88);
  if (this_01 != (DomPropertySpecifications *)0x0) {
    DomPropertySpecifications::~DomPropertySpecifications(this_01);
    operator_delete(this_01,0x38);
  }
  QString::~QString((QString *)0x1ac5ea);
  QString::~QString((QString *)0x1ac5f8);
  QString::~QString((QString *)0x1ac606);
  QString::~QString((QString *)0x1ac614);
  return;
}

Assistant:

DomCustomWidget::~DomCustomWidget()
{
    delete m_header;
    delete m_sizeHint;
    delete m_slots;
    delete m_propertyspecifications;
}